

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_parse_unary(JSParseState *s,int parse_flags)

{
  uint uVar1;
  JSAtom atom;
  uint8_t *puVar2;
  JSFunctionDef *pJVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  uint8_t uVar7;
  char *pcVar8;
  int op;
  JSValue val;
  JSAtom name;
  int label;
  int scope;
  int opcode;
  
  uVar1 = (s->token).val;
  if ((0x2d < (ulong)uVar1) || ((0x280200000000U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) {
    if (uVar1 + 0x6c < 2) {
      iVar4 = next_token(s);
      if (iVar4 != 0) {
        return -1;
      }
      iVar4 = js_parse_unary(s,0);
      if (iVar4 != 0) {
        return -1;
      }
      iVar4 = get_lvalue(s,&opcode,&scope,&name,&label,(int *)0x0,1,uVar1);
      if (iVar4 != 0) {
        return -1;
      }
      emit_op(s,(char)uVar1 + 0xfa);
      put_lvalue(s,opcode,scope,name,label,PUT_LVALUE_KEEP_TOP,0);
LAB_0014eb21:
      if ((parse_flags & 0x18U) == 0) {
        return 0;
      }
      if ((s->token).val != -0x5d) {
        return 0;
      }
      if ((parse_flags & 0x10U) != 0) {
        JS_ThrowSyntaxError(s->ctx,
                            "unparenthesized unary expression can\'t appear on the left-hand side of \'**\'"
                           );
        return -1;
      }
      iVar4 = next_token(s);
      if (iVar4 != 0) {
        return -1;
      }
      iVar4 = js_parse_unary(s,8);
      if (iVar4 != 0) {
        return -1;
      }
      uVar7 = 0x9f;
      goto LAB_0014ed81;
    }
    if (uVar1 == 0xffffffb3) {
      pJVar3 = s->cur_func;
      iVar4 = next_token(s);
      if (iVar4 != 0) {
        return -1;
      }
      iVar4 = js_parse_unary(s,0x10);
      if (iVar4 != 0) {
        return -1;
      }
      sVar6 = (size_t)pJVar3->last_opcode_pos;
      if ((long)sVar6 < 0) goto LAB_0014ed70;
      puVar2 = (pJVar3->byte_code).buf;
      uVar7 = puVar2[sVar6];
      if (uVar7 == 0xbc) {
        pcVar8 = "cannot delete a private class field";
LAB_0014edc4:
        js_parse_error(s,pcVar8);
        return -1;
      }
      if (uVar7 == 'G') {
        (pJVar3->byte_code).size = sVar6;
        pJVar3->last_opcode_pos = -1;
LAB_0014ed58:
        uVar7 = 0x98;
      }
      else {
        if (uVar7 == 'J') {
          emit_op(s,'0');
          emit_u32(s,0);
          emit_u8(s,'\x03');
          return 0;
        }
        if (uVar7 == 0xb6) {
          if ((*(int *)(puVar2 + sVar6 + 1) != 8) && (*(int *)(puVar2 + sVar6 + 1) != 0x71)) {
            if ((pJVar3->js_mode & 1) == 0) {
              puVar2[sVar6] = 0xb8;
              return 0;
            }
            pcVar8 = "cannot delete a direct reference in strict mode";
            goto LAB_0014edc4;
          }
        }
        else if (uVar7 == 'A') {
          atom = *(JSAtom *)(puVar2 + sVar6 + 1);
          (pJVar3->byte_code).size = sVar6;
          pJVar3->last_opcode_pos = -1;
          val = JS_AtomToValue(s->ctx,atom);
          iVar4 = emit_push_const(s,val,1);
          JS_FreeValue(s->ctx,val);
          JS_FreeAtom(s->ctx,atom);
          if (iVar4 != 0) {
            return -1;
          }
          goto LAB_0014ed58;
        }
LAB_0014ed70:
        emit_op(s,'\x0e');
        uVar7 = '\n';
      }
      goto LAB_0014ed81;
    }
    if (uVar1 != 0x7e) {
      if (uVar1 == 0xffffffb5) {
        iVar4 = next_token(s);
        if (iVar4 != 0) {
          return -1;
        }
        iVar4 = js_parse_unary(s,0x10);
        if (iVar4 != 0) {
          return -1;
        }
        lVar5 = (long)s->cur_func->last_opcode_pos;
        if ((-1 < lVar5) && (puVar2 = (s->cur_func->byte_code).buf, puVar2[lVar5] == 0xb6)) {
          puVar2[lVar5] = 0xb5;
        }
        uVar7 = 0x97;
        goto LAB_0014ed81;
      }
      if (uVar1 == 0xffffffd8) {
        if ((s->cur_func->field_0x84 & 2) == 0) {
          pcVar8 = "unexpected \'await\' keyword";
        }
        else {
          if (s->cur_func->in_function_body != 0) {
            iVar4 = next_token(s);
            if (iVar4 != 0) {
              return -1;
            }
            iVar4 = js_parse_unary(s,0x10);
            if (iVar4 != 0) {
              return -1;
            }
            uVar7 = 0x8b;
            goto LAB_0014ed81;
          }
          pcVar8 = "await in default expression";
        }
        js_parse_error(s,pcVar8);
        return -1;
      }
      if (uVar1 != 0xffffffb4) {
        iVar4 = js_parse_postfix_expr(s,parse_flags & 4U | 2);
        if (iVar4 != 0) {
          return -1;
        }
        if ((s->got_lf == 0) && (uVar1 = (s->token).val, (uVar1 & 0xfffffffe) == 0xffffff94)) {
          iVar4 = get_lvalue(s,&opcode,&scope,&name,&label,(int *)0x0,1,uVar1);
          if (iVar4 != 0) {
            return -1;
          }
          emit_op(s,(char)uVar1 + 0xfc);
          put_lvalue(s,opcode,scope,name,label,PUT_LVALUE_KEEP_SECOND,0);
          iVar4 = next_token(s);
          if (iVar4 != 0) {
            return -1;
          }
        }
        goto LAB_0014eb21;
      }
    }
  }
  iVar4 = next_token(s);
  if (iVar4 != 0) {
    return -1;
  }
  iVar4 = js_parse_unary(s,0x10);
  if (iVar4 != 0) {
    return -1;
  }
  if (uVar1 == 0xffffffb4) {
    emit_op(s,'\x0e');
    uVar7 = '\x06';
  }
  else if (uVar1 == 0x21) {
    uVar7 = 0x96;
  }
  else if (uVar1 == 0x2b) {
    uVar7 = 0x8d;
  }
  else if (uVar1 == 0x7e) {
    uVar7 = 0x95;
  }
  else {
    if (uVar1 != 0x2d) {
      abort();
    }
    uVar7 = 0x8c;
  }
LAB_0014ed81:
  emit_op(s,uVar7);
  return 0;
}

Assistant:

static __exception int js_parse_unary(JSParseState *s, int parse_flags)
{
    int op;

    switch(s->token.val) {
    case '+':
    case '-':
    case '!':
    case '~':
    case TOK_VOID:
        op = s->token.val;
        if (next_token(s))
            return -1;
        if (js_parse_unary(s, PF_POW_FORBIDDEN))
            return -1;
        switch(op) {
        case '-':
            emit_op(s, OP_neg);
            break;
        case '+':
            emit_op(s, OP_plus);
            break;
        case '!':
            emit_op(s, OP_lnot);
            break;
        case '~':
            emit_op(s, OP_not);
            break;
        case TOK_VOID:
            emit_op(s, OP_drop);
            emit_op(s, OP_undefined);
            break;
        default:
            abort();
        }
        parse_flags = 0;
        break;
    case TOK_DEC:
    case TOK_INC:
        {
            int opcode, op, scope, label;
            JSAtom name;
            op = s->token.val;
            if (next_token(s))
                return -1;
            if (js_parse_unary(s, 0))
                return -1;
            if (get_lvalue(s, &opcode, &scope, &name, &label, NULL, TRUE, op))
                return -1;
            emit_op(s, OP_dec + op - TOK_DEC);
            put_lvalue(s, opcode, scope, name, label, PUT_LVALUE_KEEP_TOP,
                       FALSE);
        }
        break;
    case TOK_TYPEOF:
        {
            JSFunctionDef *fd;
            if (next_token(s))
                return -1;
            if (js_parse_unary(s, PF_POW_FORBIDDEN))
                return -1;
            /* reference access should not return an exception, so we
               patch the get_var */
            fd = s->cur_func;
            if (get_prev_opcode(fd) == OP_scope_get_var) {
                fd->byte_code.buf[fd->last_opcode_pos] = OP_scope_get_var_undef;
            }
            emit_op(s, OP_typeof);
            parse_flags = 0;
        }
        break;
    case TOK_DELETE:
        if (js_parse_delete(s))
            return -1;
        parse_flags = 0;
        break;
    case TOK_AWAIT:
        if (!(s->cur_func->func_kind & JS_FUNC_ASYNC))
            return js_parse_error(s, "unexpected 'await' keyword");
        if (!s->cur_func->in_function_body)
            return js_parse_error(s, "await in default expression");
        if (next_token(s))
            return -1;
        if (js_parse_unary(s, PF_POW_FORBIDDEN))
            return -1;
        emit_op(s, OP_await);
        parse_flags = 0;
        break;
    default:
        if (js_parse_postfix_expr(s, (parse_flags & PF_ARROW_FUNC) |
                                  PF_POSTFIX_CALL))
            return -1;
        if (!s->got_lf &&
            (s->token.val == TOK_DEC || s->token.val == TOK_INC)) {
            int opcode, op, scope, label;
            JSAtom name;
            op = s->token.val;
            if (get_lvalue(s, &opcode, &scope, &name, &label, NULL, TRUE, op))
                return -1;
            emit_op(s, OP_post_dec + op - TOK_DEC);
            put_lvalue(s, opcode, scope, name, label, PUT_LVALUE_KEEP_SECOND,
                       FALSE);
            if (next_token(s))
                return -1;        
        }
        break;
    }
    if (parse_flags & (PF_POW_ALLOWED | PF_POW_FORBIDDEN)) {
#ifdef CONFIG_BIGNUM
        if (s->token.val == TOK_POW || s->token.val == TOK_MATH_POW) {
            /* Extended exponentiation syntax rules: we extend the ES7
               grammar in order to have more intuitive semantics:
               -2**2 evaluates to -4. */
            if (!(s->cur_func->js_mode & JS_MODE_MATH)) {
                if (parse_flags & PF_POW_FORBIDDEN) {
                    JS_ThrowSyntaxError(s->ctx, "unparenthesized unary expression can't appear on the left-hand side of '**'");
                    return -1;
                }
            }
            if (next_token(s))
                return -1;
            if (js_parse_unary(s, PF_POW_ALLOWED))
                return -1;
            emit_op(s, OP_pow);
        }
#else
        if (s->token.val == TOK_POW) {
            /* Strict ES7 exponentiation syntax rules: To solve
               conficting semantics between different implementations
               regarding the precedence of prefix operators and the
               postifx exponential, ES7 specifies that -2**2 is a
               syntax error. */
            if (parse_flags & PF_POW_FORBIDDEN) {
                JS_ThrowSyntaxError(s->ctx, "unparenthesized unary expression can't appear on the left-hand side of '**'");
                return -1;
            }
            if (next_token(s))
                return -1;
            if (js_parse_unary(s, PF_POW_ALLOWED))
                return -1;
            emit_op(s, OP_pow);
        }
#endif
    }
    return 0;
}